

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O3

Int32 BZ2_indexIntoF(Int32 indx,Int32 *cftab)

{
  int iVar1;
  Int32 na;
  int iVar2;
  int iVar3;
  
  iVar1 = 0;
  iVar2 = 0x100;
  do {
    iVar3 = iVar1 + iVar2 >> 1;
    if (cftab[iVar3] <= indx) {
      iVar1 = iVar3;
      iVar3 = iVar2;
    }
    iVar2 = iVar3;
  } while (iVar2 - iVar1 != 1);
  return iVar1;
}

Assistant:

Int32 BZ2_indexIntoF ( Int32 indx, Int32 *cftab )
{
   Int32 nb, na, mid;
   nb = 0;
   na = 256;
   do {
      mid = (nb + na) >> 1;
      if (indx >= cftab[mid]) nb = mid; else na = mid;
   }
   while (na - nb != 1);
   return nb;
}